

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O1

Span * __thiscall tcmalloc::PageHeap::AllocLarge(PageHeap *this,uint64_t n)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  ulong uVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  _Base_ptr p_Var6;
  long lVar7;
  Span *span;
  
  p_Var1 = &(this->large_normal_)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = *(_Base_ptr *)((long)&p_Var2->_M_color + lVar7)) {
    lVar7 = 0x10;
    uVar3 = *(ulong *)(*(long *)(p_Var2 + 1) + 0x18);
    p_Var6 = p_Var2;
    if ((uVar3 <= n) && ((uVar3 < n || (*(long *)(*(long *)(p_Var2 + 1) + 0x10) == 0)))) {
      lVar7 = 0x18;
      p_Var6 = p_Var4;
    }
    p_Var4 = p_Var6;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    span = (Span *)0x0;
  }
  else {
    span = *(Span **)(p_Var4 + 1);
  }
  p_Var1 = &(this->large_returned_)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = *(_Base_ptr *)((long)&p_Var2->_M_color + lVar7)) {
    lVar7 = 0x10;
    uVar3 = *(ulong *)(*(long *)(p_Var2 + 1) + 0x18);
    p_Var6 = p_Var2;
    if ((uVar3 <= n) && ((uVar3 < n || (*(long *)(*(long *)(p_Var2 + 1) + 0x10) == 0)))) {
      lVar7 = 0x18;
      p_Var6 = p_Var4;
    }
    p_Var4 = p_Var6;
  }
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     ((span == (Span *)0x0 || (*(ulong *)(*(long *)(p_Var4 + 1) + 0x18) < span->npages)))) {
    span = *(Span **)(p_Var4 + 1);
  }
  if (span != (Span *)0x0) {
    RemoveFromFreeList(this,span);
  }
  bVar5 = CheckSmallList(this);
  if (bVar5) {
    return span;
  }
  __assert_fail("CheckSmallList()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                ,0xca,"Span *tcmalloc::PageHeap::AllocLarge(uint64_t)");
}

Assistant:

Span* AllocLarge(uint64_t n) {
        Span bound;
        bound.npages = n;
        bound.page_id = 0;
        Span* best = nullptr;

        auto it_normal = large_normal_.upper_bound(&bound);
        if (it_normal != large_normal_.end()) {
            best = *it_normal;
        }

        auto it_returned = large_returned_.upper_bound(&bound);
        if (it_returned != large_returned_.end()) {
            if (best == nullptr || best->npages > (*it_returned)->npages) {
                best = *it_returned;
            }
        }

        if (best != nullptr) {
            RemoveFromFreeList(best);
        }
        assert(CheckSmallList());
        return best;
    }